

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall S2Loop::InitIndex(S2Loop *this)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_S2Shape_*,_false> local_38;
  S2Shape *local_30;
  ostream *local_28;
  S2Loop *local_20;
  
  local_20 = this;
  absl::make_unique<S2Loop::Shape,S2Loop*>((absl *)&local_30,&local_20);
  local_38._M_head_impl = local_30;
  local_30 = (S2Shape *)0x0;
  MutableS2ShapeIndex::Add
            (&this->index_,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_38);
  if (local_38._M_head_impl != (S2Shape *)0x0) {
    (*(local_38._M_head_impl)->_vptr_S2Shape[1])();
  }
  local_38._M_head_impl = (S2Shape *)0x0;
  if (local_30 != (S2Shape *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  if (FLAGS_s2loop_lazy_indexing == false) {
    MutableS2ShapeIndex::ForceBuild(&this->index_);
  }
  if ((FLAGS_s2debug == true) && (this->s2debug_override_ == ALLOW)) {
    bVar1 = IsValid(this);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
                 ,0x11c,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_28,"Check failed: IsValid() ");
      abort();
    }
  }
  return;
}

Assistant:

void S2Loop::InitIndex() {
  index_.Add(make_unique<Shape>(this));
  if (!FLAGS_s2loop_lazy_indexing) {
    index_.ForceBuild();
  }
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    // Note that FLAGS_s2debug is false in optimized builds (by default).
    S2_CHECK(IsValid());
  }
}